

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::ColumnChunk::ColumnChunk(ColumnChunk *this,ColumnChunk *other138)

{
  _EncryptionWithColumnKey__isset *p_Var1;
  _ColumnCryptoMetaData__isset *p_Var2;
  
  *(undefined ***)this = &PTR__ColumnChunk_024b8c58;
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  ColumnMetaData::ColumnMetaData(&this->meta_data);
  *(undefined ***)&this->crypto_metadata = &PTR__ColumnCryptoMetaData_024b8bf0;
  (this->crypto_metadata).ENCRYPTION_WITH_FOOTER_KEY =
       (EncryptionWithFooterKey)&PTR__EncryptionWithFooterKey_024b8b20;
  *(undefined ***)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY =
       &PTR__EncryptionWithColumnKey_024b8b88;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata._M_dataplus._M_p =
       (pointer)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata.field_2;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata._M_string_length = 0;
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.__isset;
  *p_Var1 = (_EncryptionWithColumnKey__isset)((byte)*p_Var1 & 0xfe);
  p_Var2 = &(this->crypto_metadata).__isset;
  *p_Var2 = (_ColumnCryptoMetaData__isset)((byte)*p_Var2 & 0xfc);
  (this->encrypted_column_metadata)._M_dataplus._M_p =
       (pointer)&(this->encrypted_column_metadata).field_2;
  (this->encrypted_column_metadata)._M_string_length = 0;
  (this->encrypted_column_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_ColumnChunk__isset)0x0;
  std::__cxx11::string::_M_assign((string *)&this->file_path);
  this->file_offset = other138->file_offset;
  ColumnMetaData::operator=(&this->meta_data,&other138->meta_data);
  this->offset_index_offset = other138->offset_index_offset;
  this->offset_index_length = other138->offset_index_length;
  this->column_index_offset = other138->column_index_offset;
  this->column_index_length = other138->column_index_length;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema,
              &(other138->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.path_in_schema.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  std::__cxx11::string::_M_assign
            ((string *)&(this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.key_metadata);
  (this->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.__isset =
       (other138->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY.__isset;
  (this->crypto_metadata).__isset = (other138->crypto_metadata).__isset;
  std::__cxx11::string::_M_assign((string *)&this->encrypted_column_metadata);
  this->__isset = other138->__isset;
  return;
}

Assistant:

ColumnChunk::ColumnChunk(const ColumnChunk& other138) {
  file_path = other138.file_path;
  file_offset = other138.file_offset;
  meta_data = other138.meta_data;
  offset_index_offset = other138.offset_index_offset;
  offset_index_length = other138.offset_index_length;
  column_index_offset = other138.column_index_offset;
  column_index_length = other138.column_index_length;
  crypto_metadata = other138.crypto_metadata;
  encrypted_column_metadata = other138.encrypted_column_metadata;
  __isset = other138.__isset;
}